

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_init
                    (ma_paged_audio_buffer_config *pConfig,ma_paged_audio_buffer *pPagedAudioBuffer)

{
  ma_data_source_config pDataSource;
  ma_paged_audio_buffer_page *pmVar1;
  void *in_RSI;
  long *in_RDI;
  ma_data_source_config dataSourceConfig;
  ma_result result;
  ma_result local_14;
  
  if (in_RSI == (void *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI != (void *)0x0) {
      memset(in_RSI,0,0x68);
    }
    if (in_RDI == (long *)0x0) {
      local_14 = MA_INVALID_ARGS;
    }
    else if (*in_RDI == 0) {
      local_14 = MA_INVALID_ARGS;
    }
    else {
      pDataSource = ma_data_source_config_init();
      local_14 = ma_data_source_init((ma_data_source_config *)
                                     &g_ma_paged_audio_buffer_data_source_vtable,pDataSource.vtable)
      ;
      if (local_14 == MA_SUCCESS) {
        *(long *)((long)in_RSI + 0x48) = *in_RDI;
        pmVar1 = ma_paged_audio_buffer_data_get_head((ma_paged_audio_buffer_data *)*in_RDI);
        *(ma_paged_audio_buffer_page **)((long)in_RSI + 0x50) = pmVar1;
        *(undefined8 *)((long)in_RSI + 0x58) = 0;
        *(undefined8 *)((long)in_RSI + 0x60) = 0;
        local_14 = MA_SUCCESS;
      }
    }
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_init(const ma_paged_audio_buffer_config* pConfig, ma_paged_audio_buffer* pPagedAudioBuffer)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pPagedAudioBuffer);

    /* A config is required for the format and channel count. */
    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->pData == NULL) {
        return MA_INVALID_ARGS; /* No underlying data specified. */
    }

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_paged_audio_buffer_data_source_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pPagedAudioBuffer->ds);
    if (result != MA_SUCCESS) {
        return result;
    }

    pPagedAudioBuffer->pData          = pConfig->pData;
    pPagedAudioBuffer->pCurrent       = ma_paged_audio_buffer_data_get_head(pConfig->pData);
    pPagedAudioBuffer->relativeCursor = 0;
    pPagedAudioBuffer->absoluteCursor = 0;

    return MA_SUCCESS;
}